

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O3

unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true> __thiscall
duckdb::ValidityInitScan(duckdb *this,ColumnSegment *segment)

{
  block_id_t bVar1;
  ValidityScanState *pVVar2;
  BufferManager *pBVar3;
  pointer pVVar4;
  BlockHandle *pBVar5;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ValidityScanState_*,_false> local_38;
  BufferHandle local_30;
  
  pVVar2 = (ValidityScanState *)operator_new(0x28);
  (pVVar2->super_SegmentScanState)._vptr_SegmentScanState = (_func_int **)0x0;
  (pVVar2->handle).handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (pVVar2->handle).handle.internal.
  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pVVar2->handle).node.ptr = (FileBuffer *)0x0;
  pVVar2->block_id = 0;
  (pVVar2->super_SegmentScanState)._vptr_SegmentScanState =
       (_func_int **)&PTR__ValidityScanState_02468640;
  BufferHandle::BufferHandle(&pVVar2->handle);
  local_38._M_head_impl = pVVar2;
  pBVar3 = BufferManager::GetBufferManager(segment->db);
  (*pBVar3->_vptr_BufferManager[7])(&local_30,pBVar3,&segment->block);
  pVVar4 = unique_ptr<duckdb::ValidityScanState,_std::default_delete<duckdb::ValidityScanState>,_true>
           ::operator->((unique_ptr<duckdb::ValidityScanState,_std::default_delete<duckdb::ValidityScanState>,_true>
                         *)&local_38);
  BufferHandle::operator=(&pVVar4->handle,&local_30);
  BufferHandle::~BufferHandle(&local_30);
  pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&segment->block);
  bVar1 = pBVar5->block_id;
  pVVar4 = unique_ptr<duckdb::ValidityScanState,_std::default_delete<duckdb::ValidityScanState>,_true>
           ::operator->((unique_ptr<duckdb::ValidityScanState,_std::default_delete<duckdb::ValidityScanState>,_true>
                         *)&local_38);
  pVVar4->block_id = bVar1;
  *(ValidityScanState **)this = local_38._M_head_impl;
  return (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)
         (unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>_>)this;
}

Assistant:

unique_ptr<SegmentScanState> ValidityInitScan(ColumnSegment &segment) {
	auto result = make_uniq<ValidityScanState>();
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	result->handle = buffer_manager.Pin(segment.block);
	result->block_id = segment.block->BlockId();
	return std::move(result);
}